

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O0

void __thiscall Fl_File_Input::draw(Fl_File_Input *this)

{
  byte bVar1;
  Fl_Boxtype t;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Color c;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Fl_File_Input *pFVar10;
  bool bVar11;
  char must_trick_fl_input_;
  Fl_Boxtype b;
  Fl_File_Input *this_local;
  
  t = Fl_Widget::box((Fl_Widget *)this);
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0x90) != 0) {
    draw_buttons(this);
  }
  pFVar10 = (Fl_File_Input *)Fl::focus();
  bVar11 = false;
  if (pFVar10 != this) {
    iVar2 = Fl_Input_::size((Fl_Input_ *)this);
    bVar11 = false;
    if (iVar2 == 0) {
      bVar1 = Fl_Widget::damage((Fl_Widget *)this);
      bVar11 = (bVar1 & 0x80) == 0;
    }
  }
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if (((bVar1 & 0x80) != 0) || (bVar11)) {
    iVar2 = Fl_Widget::x((Fl_Widget *)this);
    iVar3 = Fl_Widget::y((Fl_Widget *)this);
    iVar4 = Fl_Widget::w((Fl_Widget *)this);
    iVar5 = Fl_Widget::h((Fl_Widget *)this);
    c = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,t,iVar2,iVar3 + 10,iVar4,iVar5 + -10,c);
  }
  if (!bVar11) {
    iVar2 = Fl_Widget::x((Fl_Widget *)this);
    iVar3 = Fl::box_dx(t);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl::box_dy(t);
    iVar6 = Fl_Widget::w((Fl_Widget *)this);
    iVar7 = Fl::box_dw(t);
    iVar8 = Fl_Widget::h((Fl_Widget *)this);
    iVar9 = Fl::box_dh(t);
    Fl_Input_::drawtext((Fl_Input_ *)this,iVar2 + iVar3 + 3,iVar4 + iVar5 + 10,(iVar6 - iVar7) + -6,
                        (iVar8 - iVar9) + -10);
  }
  return;
}

Assistant:

void Fl_File_Input::draw() {
  Fl_Boxtype b = box();
  if (damage() & (FL_DAMAGE_BAR | FL_DAMAGE_ALL)) draw_buttons();
  // this flag keeps Fl_Input_::drawtext from drawing a bogus box!
  char must_trick_fl_input_ = 
    Fl::focus()!=this && !size() && !(damage()&FL_DAMAGE_ALL);
  if ((damage() & FL_DAMAGE_ALL) || must_trick_fl_input_) 
    draw_box(b,x(),y()+DIR_HEIGHT,w(),h()-DIR_HEIGHT,color());
  if (!must_trick_fl_input_) 
    Fl_Input_::drawtext(x()+Fl::box_dx(b)+3, y()+Fl::box_dy(b)+DIR_HEIGHT,
		        w()-Fl::box_dw(b)-6, h()-Fl::box_dh(b)-DIR_HEIGHT);
}